

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Value * __thiscall
soul::heart::Parser::parseConstant
          (Value *__return_storage_ptr__,Parser *this,Type *requiredType,bool throwOnError)

{
  ProgramImpl *pPVar1;
  bool bVar2;
  Category CVar3;
  Handle h;
  ArraySize AVar4;
  int64_t iVar5;
  Structure *this_00;
  Member *requiredType_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong index;
  char *expected;
  RefCountedPtr<soul::Structure> *this_01;
  Value *in_R8;
  ArrayView<soul::Value> elements;
  ArrayView<soul::Value> elements_00;
  ArrayView<soul::Value> members;
  undefined1 local_2e8 [32];
  uchar *local_2c8;
  size_t local_2c0;
  size_t local_2b8;
  uchar local_2b0 [16];
  double local_2a0;
  PrimitiveType local_294;
  undefined1 local_290 [24];
  undefined1 local_278 [40];
  RefCountedPtr<soul::Structure> local_250;
  ArrayWithPreallocation<soul::Value,_8UL> memberValues;
  
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x275da0);
  if (bVar2) {
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x2748be);
    if (bVar2) {
      Type::Type((Type *)(local_278 + 0x18),requiredType);
      soul::Value::zeroInitialiser(__return_storage_ptr__,(Type *)(local_278 + 0x18));
      this_01 = &local_250;
LAB_0024e47a:
      RefCountedPtr<soul::Structure>::~RefCountedPtr(this_01);
      return __return_storage_ptr__;
    }
    CVar3 = requiredType->category;
    if (CVar3 == structure) {
      this_00 = Type::getStructRef(requiredType);
      memberValues.items = (Value *)memberValues.space;
      memberValues.numActive = 0;
      memberValues.numAllocated = 8;
      ArrayWithPreallocation<soul::Value,_8UL>::reserve(&memberValues,(this_00->members).numActive);
      for (index = 0; index < (this_00->members).numActive; index = index + 1) {
        requiredType_00 =
             ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator[]
                       (&this_00->members,index);
        parseConstant((Value *)local_2e8,this,&requiredType_00->type,true);
        ArrayWithPreallocation<soul::Value,_8UL>::push_back(&memberValues,(Value *)local_2e8);
        soul::Value::~Value((Value *)local_2e8);
        expected = ",";
        if (index == (this_00->members).numActive - 1) {
          expected = "}";
        }
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::expect<soul::TokenType>
                  (&this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   ,(TokenType)expected);
      }
      members.s = memberValues.items + memberValues.numActive;
      members.e = in_R8;
      soul::Value::createStruct
                (__return_storage_ptr__,(Value *)this_00,(Structure *)memberValues.items,members);
      ArrayWithPreallocation<soul::Value,_8UL>::clear(&memberValues);
      return __return_storage_ptr__;
    }
    if (CVar3 == array) {
      Type::Type((Type *)local_290,requiredType);
      Type::getArrayElementType((Type *)local_2e8,requiredType);
      AVar4 = Type::getArraySize(requiredType);
      parseConstantList((vector<soul::Value,_std::allocator<soul::Value>_> *)&memberValues,this,
                        (Type *)local_2e8,AVar4);
      elements_00.e = in_R8;
      elements_00.s = (Value *)memberValues.numActive;
      soul::Value::createArrayOrVector
                (__return_storage_ptr__,(Value *)local_290,&(memberValues.items)->type,elements_00);
      std::vector<soul::Value,_std::allocator<soul::Value>_>::~vector
                ((vector<soul::Value,_std::allocator<soul::Value>_> *)&memberValues);
      RefCountedPtr<soul::Structure>::~RefCountedPtr
                ((RefCountedPtr<soul::Structure> *)(local_2e8 + 0x10));
      this_01 = (RefCountedPtr<soul::Structure> *)(local_290 + 0x10);
      goto LAB_0024e47a;
    }
    if (CVar3 == vector) {
      Type::Type((Type *)local_278,requiredType);
      Type::getVectorElementType((Type *)&local_294);
      local_2e8._1_3_ = 0;
      local_2e8[0] = local_294.type != invalid;
      local_2e8._4_4_ = local_294.type;
      local_2e8._8_8_ = 0;
      local_2e8._16_8_ = (Structure *)0x0;
      AVar4 = Type::getVectorSize(requiredType);
      parseConstantList((vector<soul::Value,_std::allocator<soul::Value>_> *)&memberValues,this,
                        (Type *)local_2e8,AVar4);
      elements.e = in_R8;
      elements.s = (Value *)memberValues.numActive;
      soul::Value::createArrayOrVector
                (__return_storage_ptr__,(Value *)local_278,&(memberValues.items)->type,elements);
      std::vector<soul::Value,_std::allocator<soul::Value>_>::~vector
                ((vector<soul::Value,_std::allocator<soul::Value>_> *)&memberValues);
      RefCountedPtr<soul::Structure>::~RefCountedPtr
                ((RefCountedPtr<soul::Structure> *)(local_2e8 + 0x10));
      this_01 = (RefCountedPtr<soul::Structure> *)(local_278 + 0x10);
      goto LAB_0024e47a;
    }
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x296b6c);
  if (bVar2) {
    parseConstant((Value *)&memberValues,this,requiredType,throwOnError);
    negate(__return_storage_ptr__,this,(Value *)&memberValues);
    goto LAB_0024e605;
  }
  CVar3 = requiredType->category;
  if ((CVar3 & ~primitive) == wrap) {
    iVar5 = parseLiteralInt(this);
    bVar2 = Type::isValidBoundedIntIndex<long>(requiredType,iVar5);
    if (!bVar2) {
      Errors::indexOutOfRange<>();
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&memberValues);
      CompileMessage::~CompileMessage((CompileMessage *)&memberValues);
    }
    soul::Value::Value((Value *)&memberValues,iVar5);
    soul::Value::castToTypeWithError<soul::CodeLocation&>
              (__return_storage_ptr__,(Value *)&memberValues,requiredType,
               &(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).location);
    goto LAB_0024e605;
  }
  if (CVar3 != primitive) {
LAB_0024e985:
    if ((CVar3 & ~primitive) == vector) {
      Type::getElementType((Type *)local_2e8,requiredType);
      parseConstant((Value *)&memberValues,this,(Type *)local_2e8,false);
      RefCountedPtr<soul::Structure>::~RefCountedPtr
                ((RefCountedPtr<soul::Structure> *)(local_2e8 + 0x10));
      local_2c8 = local_2b0;
      local_2e8._16_8_ = (Structure *)0x0;
      local_2e8._24_8_ = 0;
      local_2e8._0_8_ = (pointer)0x0;
      local_2e8._8_8_ = 0;
      local_2c0 = 0;
      local_2b8 = 8;
      bVar2 = soul::Value::operator!=((Value *)&memberValues,(Value *)local_2e8);
      soul::Value::~Value((Value *)local_2e8);
      if (bVar2) {
        soul::Value::castToTypeWithError<soul::CodeLocation&>
                  (__return_storage_ptr__,(Value *)&memberValues,requiredType,
                   &(this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ).location);
        goto LAB_0024e605;
      }
      soul::Value::~Value((Value *)&memberValues);
      CVar3 = requiredType->category;
    }
    if (CVar3 == stringLiteral) {
      std::__cxx11::string::string
                ((string *)&memberValues,
                 (string *)
                 &(this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ).currentStringValue);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x275d47);
      pPVar1 = (this->program).pimpl;
      h.handle = (*(pPVar1->stringDictionary).super_StringDictionary._vptr_StringDictionary[2])
                           (&pPVar1->stringDictionary,memberValues.numActive,memberValues.items);
      soul::Value::createStringLiteral(__return_storage_ptr__,h);
      std::__cxx11::string::~string((string *)&memberValues);
      return __return_storage_ptr__;
    }
switchD_0024e64f_caseD_4:
    if (throwOnError) {
      getTypeDescription_abi_cxx11_((string *)local_2e8,this,requiredType);
      Errors::expectedExpressionOfType<std::__cxx11::string>
                ((CompileMessage *)&memberValues,(Errors *)local_2e8,args);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&memberValues);
      CompileMessage::~CompileMessage((CompileMessage *)&memberValues);
      std::__cxx11::string::~string((string *)local_2e8);
    }
    (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
    (__return_storage_ptr__->allocatedData).allocatedSize = 0;
    (__return_storage_ptr__->type).category = invalid;
    (__return_storage_ptr__->type).arrayElementCategory = invalid;
    (__return_storage_ptr__->type).isRef = false;
    (__return_storage_ptr__->type).isConstant = false;
    (__return_storage_ptr__->type).primitiveType = invalid;
    (__return_storage_ptr__->type).boundingSize = 0;
    (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.items =
         (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
    (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
    return __return_storage_ptr__;
  }
  switch((requiredType->primitiveType).type) {
  case float32:
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x275cde);
    if ((bVar2) ||
       (bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x275ce9), bVar2)) {
      soul::Value::Value(__return_storage_ptr__,
                         (float)(this->
                                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                ).literalIntValue);
      return __return_storage_ptr__;
    }
    parseNaNandInfinityTokens((Value *)&memberValues,this);
    if (((char)memberValues.items != '\0') && (memberValues.items._4_4_ == 2)) {
      soul::Value::Value(__return_storage_ptr__,(Value *)&memberValues);
      goto LAB_0024e605;
    }
    local_2a0 = (this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).literalDoubleValue;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x275d8c);
    soul::Value::Value((Value *)local_2e8,local_2a0);
    soul::Value::castToTypeWithError<soul::CodeLocation&>
              (__return_storage_ptr__,(Value *)local_2e8,requiredType,
               &(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).location);
    break;
  case float64:
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x275cde);
    if ((bVar2) ||
       (bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x275ce9), bVar2)) {
      soul::Value::Value(__return_storage_ptr__,
                         (double)(this->
                                 super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                 ).literalIntValue);
      return __return_storage_ptr__;
    }
    parseNaNandInfinityTokens((Value *)&memberValues,this);
    if (((char)memberValues.items != '\0') && (memberValues.items._4_4_ == 3)) {
      soul::Value::Value(__return_storage_ptr__,(Value *)&memberValues);
      goto LAB_0024e605;
    }
    local_2a0 = (this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).literalDoubleValue;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x275d83);
    soul::Value::Value((Value *)local_2e8,local_2a0);
    soul::Value::castToTypeWithError<soul::CodeLocation&>
              (__return_storage_ptr__,(Value *)local_2e8,requiredType,
               &(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).location);
    break;
  default:
    goto switchD_0024e64f_caseD_4;
  case int32:
    iVar5 = (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).literalIntValue;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x275cde);
    soul::Value::Value((Value *)&memberValues,iVar5);
    soul::Value::castToTypeWithError<soul::CodeLocation&>
              (__return_storage_ptr__,(Value *)&memberValues,requiredType,
               &(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).location);
    goto LAB_0024e605;
  case int64:
    iVar5 = (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).literalIntValue;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x275ce9);
    soul::Value::Value((Value *)&memberValues,iVar5);
    soul::Value::castToTypeWithError<soul::CodeLocation&>
              (__return_storage_ptr__,(Value *)&memberValues,requiredType,
               &(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).location);
    goto LAB_0024e605;
  case bool_:
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"true");
    if (bVar2) {
      bVar2 = true;
LAB_0024e8f3:
      soul::Value::Value(__return_storage_ptr__,bVar2);
      return __return_storage_ptr__;
    }
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"false");
    if (bVar2) {
      bVar2 = false;
      goto LAB_0024e8f3;
    }
    CVar3 = requiredType->category;
    goto LAB_0024e985;
  }
  soul::Value::~Value((Value *)local_2e8);
LAB_0024e605:
  soul::Value::~Value((Value *)&memberValues);
  return __return_storage_ptr__;
}

Assistant:

Value parseConstant (const Type& requiredType, bool throwOnError)
    {
        if (matchIf (HEARTOperator::openBrace))
        {
            if (matchIf (HEARTOperator::closeBrace))
                return Value::zeroInitialiser (requiredType);

            if (requiredType.isVector())
                return Value::createArrayOrVector (requiredType,
                                                   parseConstantList (requiredType.getVectorElementType(),
                                                                      requiredType.getVectorSize()));

            if (requiredType.isArray())
                return Value::createArrayOrVector (requiredType,
                                                   parseConstantList (requiredType.getArrayElementType(),
                                                                      requiredType.getArraySize()));

            if (requiredType.isStruct())
            {
                auto& s = requiredType.getStructRef();
                ArrayWithPreallocation<Value, 8> memberValues;
                memberValues.reserve (s.getNumMembers());

                for (size_t i = 0; i < s.getNumMembers(); ++i)
                {
                    memberValues.push_back (parseConstant (s.getMemberType (i), true));

                    if (i == s.getNumMembers() - 1)
                        expect (HEARTOperator::closeBrace);
                    else
                        expect (HEARTOperator::comma);
                }

                return Value::createStruct (s, memberValues);
            }
        }

        if (matchIf (HEARTOperator::minus))
            return negate (parseConstant (requiredType, throwOnError));

        if (requiredType.isBoundedInt())
        {
            auto val = parseLiteralInt();

            if (! requiredType.isValidBoundedIntIndex (val))
                throwError (Errors::indexOutOfRange());

            return castValue (Value (val), requiredType);
        }

        if (requiredType.isPrimitive())
        {
            if (requiredType.isFloat64())
            {
                if (matchIf (Token::literalInt32) || matchIf (Token::literalInt64))
                    return Value ((double) literalIntValue);

                auto infOrNaN = parseNaNandInfinityTokens();

                if (infOrNaN.isValid() && infOrNaN.getType().isFloat64())
                    return infOrNaN;

                auto val = literalDoubleValue;
                expect (Token::literalFloat64);
                return castValue (Value (val), requiredType);
            }

            if (requiredType.isFloat32())
            {
                if (matchIf (Token::literalInt32) || matchIf (Token::literalInt64))
                    return Value ((float) literalIntValue);

                auto infOrNaN = parseNaNandInfinityTokens();

                if (infOrNaN.isValid() && infOrNaN.getType().isFloat32())
                    return infOrNaN;

                auto val = literalDoubleValue;
                expect (Token::literalFloat32);
                return castValue (Value (val), requiredType);
            }

            if (requiredType.isInteger32())
            {
                auto val = literalIntValue;
                expect (Token::literalInt32);
                return castValue (Value (val), requiredType);
            }

            if (requiredType.isInteger64())
            {
                auto val = literalIntValue;
                expect (Token::literalInt64);
                return castValue (Value (val), requiredType);
            }

            if (requiredType.isBool())
            {
                if (matchIf ("true"))  return Value (true);
                if (matchIf ("false")) return Value (false);
            }
        }

        if (requiredType.isArrayOrVector())
        {
            auto singleValue = parseConstant (requiredType.getElementType(), false);

            if (singleValue != Value())
                return castValue (singleValue, requiredType);
        }

        if (requiredType.isStringLiteral())
        {
            auto n = currentStringValue;
            expect (Token::literalString);
            return Value::createStringLiteral (program.getStringDictionary().getHandleForString (n));
        }

        if (throwOnError)
            throwError (Errors::expectedExpressionOfType (getTypeDescription (requiredType)));

        return {};
    }